

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

void acvf2acf(double *acorr,int M)

{
  double dVar1;
  ulong uVar2;
  
  dVar1 = *acorr;
  *acorr = 1.0;
  if (1 < M) {
    uVar2 = 1;
    do {
      acorr[uVar2] = acorr[uVar2] / dVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)M != uVar2);
  }
  return;
}

Assistant:

void acvf2acf(double *acorr, int M) {
	// Converts Autocovariance to autocorrelation function
	int i;
	double var;

	var = acorr[0];
	acorr[0] = 1.0;

	for (i = 1; i < M; i++) {
		acorr[i] = acorr[i] / var;
	}
}